

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Sample(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  undefined8 uVar1;
  Tuple2<pbrt::Vector2,_float> TVar2;
  uint32_t uVar3;
  int iVar4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar5;
  float *pfVar6;
  float *pfVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  uint32_t uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar31 [64];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float w0;
  float fVar36;
  undefined1 auVar37 [16];
  float w1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  PLSample PVar50;
  float local_48 [2];
  uint local_40;
  float fStack_3c;
  float param_weight [4];
  
  auVar31._8_56_ = in_register_00001208;
  auVar31._0_8_ = sample.super_Tuple2<pbrt::Vector2,_float>;
  auVar28 = auVar31._0_16_;
  auVar26 = vmovshdup_avx(auVar28);
  pvVar5 = (this->m_param_values).ptr;
  iVar10 = 0;
  lVar19 = 0;
  auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar28);
  auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar26);
  bVar8 = true;
  do {
    bVar18 = bVar8;
    uVar15 = this->m_param_size[lVar19];
    if ((ulong)uVar15 == 1) {
      uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_48 + lVar19 * 2) = uVar1;
    }
    else {
      pfVar6 = pvVar5[lVar19].ptr;
      if (uVar15 < 3) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)uVar15 - 2;
        lVar14 = 1;
        uVar24 = uVar20;
        do {
          uVar21 = uVar24 >> 1;
          uVar24 = ~uVar21 + uVar24;
          lVar9 = uVar21 + 1 + lVar14;
          if (param[lVar19] < pfVar6[uVar21 + lVar14 & 0xffffffff]) {
            uVar24 = uVar21;
            lVar9 = lVar14;
          }
          lVar14 = lVar9;
        } while (0 < (long)uVar24);
        if (lVar14 - 1U < uVar20) {
          uVar20 = lVar14 - 1U;
        }
        if (lVar14 < 1) {
          uVar20 = 0;
        }
      }
      auVar40._0_4_ =
           (param[lVar19] - pfVar6[uVar20 & 0xffffffff]) /
           (pfVar6[(int)uVar20 + 1] - pfVar6[uVar20 & 0xffffffff]);
      auVar40._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar29 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar40);
      uVar1 = vcmpss_avx512f(auVar40,ZEXT816(0) << 0x40,1);
      fVar25 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar29._0_4_);
      local_48[lVar19 * 2 + 1] = fVar25;
      local_48[lVar19 * 2] = 1.0 - fVar25;
      iVar10 = (int)uVar20 * this->m_param_strides[lVar19] + iVar10;
    }
    lVar19 = 1;
    bVar8 = false;
  } while (bVar18);
  iVar16 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  pfVar6 = (this->m_marginal_cdf).ptr;
  uVar3 = this->m_param_strides[1];
  uVar1 = vcmpss_avx512f(auVar28,SUB6416(ZEXT464(0x33800000),0),1);
  bVar8 = (bool)((byte)uVar1 & 1);
  uVar1 = vcmpss_avx512f(auVar26,SUB6416(ZEXT464(0x33800000),0),1);
  bVar18 = (bool)((byte)uVar1 & 1);
  fVar25 = (float)((uint)bVar18 * 0x33800000 + (uint)!bVar18 * auVar35._0_4_);
  if ((long)iVar16 < 3) {
    uVar11 = this->m_param_strides[0];
    iVar23 = 0;
    iVar13 = uVar11 * iVar16;
  }
  else {
    uVar11 = this->m_param_strides[0];
    uVar24 = (long)iVar16 - 2;
    lVar19 = 1;
    iVar13 = uVar11 * iVar16;
    uVar20 = uVar24;
    do {
      uVar21 = uVar20 >> 1;
      uVar22 = (int)uVar21 + (int)lVar19 + iVar16 * iVar10;
      uVar15 = uVar22 + uVar3 * iVar16;
      uVar20 = ~uVar21 + uVar20;
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar22 + iVar13])),
                                ZEXT416((uint)local_48[0]),ZEXT416((uint)pfVar6[uVar22]));
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar15 + iVar13])),
                                ZEXT416((uint)local_48[0]),ZEXT416((uint)pfVar6[uVar15]));
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fStack_3c)),ZEXT416(local_40),auVar35
                               );
      lVar14 = uVar21 + 1 + lVar19;
      if (fVar25 <= auVar35._0_4_) {
        uVar20 = uVar21;
        lVar14 = lVar19;
      }
      lVar19 = lVar14;
    } while (0 < (long)uVar20);
    if (lVar19 - 1U < uVar24) {
      uVar24 = lVar19 - 1U;
    }
    iVar23 = (int)uVar24;
    if (lVar19 < 1) {
      iVar23 = 0;
    }
  }
  uVar15 = iVar16 * iVar10 + iVar23;
  uVar22 = uVar3 * iVar16 + uVar15;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[iVar13 + uVar15])),
                            ZEXT416((uint)local_48[0]),ZEXT416((uint)pfVar6[uVar15]));
  iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  lVar19 = (long)iVar4;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[iVar13 + uVar22])),
                            ZEXT416((uint)local_48[0]),ZEXT416((uint)pfVar6[uVar22]));
  iVar16 = iVar4 * iVar16;
  iVar13 = uVar3 * iVar16;
  iVar17 = iVar16 * uVar11;
  iVar10 = iVar10 * iVar16 + iVar4 * iVar23;
  pfVar6 = (this->m_conditional_cdf).ptr;
  uVar15 = iVar4 + -1 + iVar10;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fStack_3c)),ZEXT416(local_40),auVar35);
  auVar28 = ZEXT416((uint)local_48[0]);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar15 + iVar17])),auVar28,
                            ZEXT416((uint)pfVar6[uVar15]));
  fVar25 = fVar25 - auVar35._0_4_;
  uVar22 = iVar10 + -1 + iVar4 * 2;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar15 + iVar13 + iVar17])),auVar28,
                            ZEXT416((uint)pfVar6[uVar15 + iVar13]));
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * fStack_3c)),ZEXT416(local_40),auVar26);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar22 + iVar17])),auVar28,
                            ZEXT416((uint)pfVar6[uVar22]));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar22 + iVar13 + iVar17])),auVar28,
                            ZEXT416((uint)pfVar6[uVar22 + iVar13]));
  auVar29 = ZEXT416(local_40);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar28._0_4_ * fStack_3c)),auVar29,auVar26);
  fVar41 = auVar35._0_4_;
  fVar33 = auVar26._0_4_;
  fVar32 = fVar41 - fVar33;
  auVar26._8_4_ = 0x7fffffff;
  auVar26._0_8_ = 0x7fffffff7fffffff;
  auVar26._12_4_ = 0x7fffffff;
  auVar26 = vandps_avx512vl(ZEXT416((uint)fVar32),auVar26);
  if ((fVar41 + fVar33) * 0.0001 <= auVar26._0_4_) {
    auVar28._0_12_ = ZEXT812(0);
    auVar28._12_4_ = 0;
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * -2.0 * fVar32)),auVar35,auVar35);
    auVar26 = vmaxss_avx(auVar26,auVar28);
    auVar26 = vsqrtss_avx(auVar26,auVar26);
    fVar25 = fVar41 - auVar26._0_4_;
  }
  else {
    fVar25 = fVar25 + fVar25;
    fVar32 = fVar41 + fVar33;
  }
  fVar25 = fVar25 / fVar32;
  uVar15 = 0;
  fVar41 = 1.0 - fVar25;
  auVar35 = vfmadd213ss_fma(auVar35,ZEXT416((uint)fVar41),ZEXT416((uint)(fVar33 * fVar25)));
  fVar32 = auVar35._0_4_ * (float)((uint)bVar8 * 0x33800000 + (uint)!bVar8 * auVar27._0_4_);
  auVar27 = ZEXT416((uint)local_48[0]);
  if (2 < iVar4) {
    uVar20 = lVar19 - 2;
    lVar14 = 1;
    uVar24 = uVar20;
    do {
      uVar21 = uVar24 >> 1;
      uVar15 = (int)uVar21 + (int)lVar14 + iVar10;
      uVar22 = uVar15 + iVar13;
      uVar24 = ~uVar21 + uVar24;
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar15 + iVar17])),auVar27,
                                ZEXT416((uint)pfVar6[uVar15]));
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar22 + iVar17])),auVar27,
                                ZEXT416((uint)pfVar6[uVar22]));
      auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] *
                                              pfVar6[lVar19 + (ulong)(uVar22 + iVar17)])),auVar27,
                                ZEXT416((uint)pfVar6[lVar19 + (ulong)uVar22]));
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fStack_3c)),auVar29,auVar35);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] *
                                              pfVar6[lVar19 + (ulong)(uVar15 + iVar17)])),auVar27,
                                ZEXT416((uint)pfVar6[lVar19 + (ulong)uVar15]));
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar28._0_4_ * fStack_3c)),ZEXT416(local_40),auVar26
                               );
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fVar25)),ZEXT416((uint)fVar41),
                                auVar35);
      lVar9 = uVar21 + 1 + lVar14;
      if (fVar32 <= auVar35._0_4_) {
        uVar24 = uVar21;
        lVar9 = lVar14;
      }
      lVar14 = lVar9;
    } while (0 < (long)uVar24);
    if (lVar14 - 1U < uVar20) {
      uVar20 = lVar14 - 1U;
    }
    uVar15 = (uint)uVar20;
    if (lVar14 < 1) {
      uVar15 = 0;
    }
  }
  uVar22 = iVar10 + uVar15;
  pfVar7 = (this->m_data).ptr;
  uVar12 = iVar13 + uVar22;
  uVar20 = (ulong)(uVar22 + iVar17);
  uVar24 = (ulong)(iVar17 + uVar12);
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar20])),auVar27,
                            ZEXT416((uint)pfVar6[uVar22]));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[uVar24])),auVar27,
                            ZEXT416((uint)pfVar6[uVar12]));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[lVar19 + uVar24])),auVar27,
                            ZEXT416((uint)pfVar6[lVar19 + (ulong)uVar12]));
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(pfVar7 + lVar19 + (ulong)uVar12);
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fStack_3c)),ZEXT416(local_40),auVar35);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(local_48[1] * pfVar6[lVar19 + uVar20])),auVar27,
                            ZEXT416((uint)pfVar6[lVar19 + (ulong)uVar22]));
  auVar37._4_4_ = local_48[0];
  auVar37._0_4_ = local_48[0];
  auVar37._8_4_ = local_48[0];
  auVar37._12_4_ = local_48[0];
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar28._0_4_ * fStack_3c)),auVar29,auVar27);
  auVar29._4_4_ = local_40;
  auVar29._0_4_ = local_40;
  auVar29._8_4_ = local_40;
  auVar29._12_4_ = local_40;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * fVar25)),ZEXT416((uint)fVar41),auVar35);
  fVar32 = fVar32 - auVar27._0_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(pfVar7 + uVar22);
  auVar47._0_4_ = (float)*(undefined8 *)(pfVar7 + uVar24) * local_48[1];
  auVar47._4_4_ = (float)((ulong)*(undefined8 *)(pfVar7 + uVar24) >> 0x20) * local_48[1];
  auVar47._8_4_ = local_48[1] * 0.0;
  auVar47._12_4_ = local_48[1] * 0.0;
  auVar45._0_4_ = (float)*(undefined8 *)(pfVar7 + uVar20) * local_48[1];
  auVar45._4_4_ = (float)((ulong)*(undefined8 *)(pfVar7 + uVar20) >> 0x20) * local_48[1];
  auVar45._8_4_ = local_48[1] * 0.0;
  auVar45._12_4_ = local_48[1] * 0.0;
  auVar27 = vfmadd231ps_fma(auVar45,auVar37,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(pfVar7 + uVar12);
  auVar35 = vfmadd231ps_fma(auVar47,auVar37,auVar43);
  auVar44._0_4_ = auVar35._0_4_ * fStack_3c;
  auVar44._4_4_ = auVar35._4_4_ * fStack_3c;
  auVar44._8_4_ = auVar35._8_4_ * fStack_3c;
  auVar44._12_4_ = auVar35._12_4_ * fStack_3c;
  auVar27 = vfmadd231ps_fma(auVar44,auVar29,auVar27);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(pfVar7 + lVar19 + (ulong)uVar22);
  auVar48._0_4_ = (float)*(undefined8 *)(pfVar7 + lVar19 + uVar20) * local_48[1];
  auVar48._4_4_ = (float)((ulong)*(undefined8 *)(pfVar7 + lVar19 + uVar20) >> 0x20) * local_48[1];
  auVar48._8_4_ = local_48[1] * 0.0;
  auVar48._12_4_ = local_48[1] * 0.0;
  auVar38._0_4_ = (float)*(undefined8 *)(pfVar7 + lVar19 + uVar24) * local_48[1];
  auVar38._4_4_ = (float)((ulong)*(undefined8 *)(pfVar7 + lVar19 + uVar24) >> 0x20) * local_48[1];
  auVar38._8_4_ = local_48[1] * 0.0;
  auVar38._12_4_ = local_48[1] * 0.0;
  auVar35 = vfmadd231ps_fma(auVar38,auVar37,auVar49);
  auVar26 = vfmadd231ps_fma(auVar48,auVar37,auVar46);
  auVar34._0_4_ = fStack_3c * auVar35._0_4_;
  auVar34._4_4_ = fStack_3c * auVar35._4_4_;
  auVar34._8_4_ = fStack_3c * auVar35._8_4_;
  auVar34._12_4_ = fStack_3c * auVar35._12_4_;
  auVar35 = vfmadd231ps_fma(auVar34,auVar29,auVar26);
  auVar30._0_4_ = fVar25 * auVar35._0_4_;
  auVar30._4_4_ = fVar25 * auVar35._4_4_;
  auVar30._8_4_ = fVar25 * auVar35._8_4_;
  auVar30._12_4_ = fVar25 * auVar35._12_4_;
  auVar35._4_4_ = fVar41;
  auVar35._0_4_ = fVar41;
  auVar35._8_4_ = fVar41;
  auVar35._12_4_ = fVar41;
  auVar35 = vfmadd213ps_fma(auVar35,auVar27,auVar30);
  auVar27 = vmovshdup_avx(auVar35);
  fVar33 = auVar35._0_4_;
  fVar36 = auVar27._0_4_;
  fVar41 = fVar33 - fVar36;
  auVar27._8_4_ = 0x7fffffff;
  auVar27._0_8_ = 0x7fffffff7fffffff;
  auVar27._12_4_ = 0x7fffffff;
  auVar27 = vandps_avx512vl(ZEXT416((uint)fVar41),auVar27);
  if ((fVar33 + fVar36) * 0.0001 <= auVar27._0_4_) {
    auVar39._0_12_ = ZEXT812(0);
    auVar39._12_4_ = 0;
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * -2.0 * fVar41)),auVar35,auVar35);
    auVar27 = vmaxss_avx(auVar27,auVar39);
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    fVar32 = fVar33 - auVar27._0_4_;
  }
  else {
    fVar32 = fVar32 + fVar32;
    fVar41 = fVar33 + fVar36;
  }
  fVar32 = fVar32 / fVar41;
  auVar27 = vpinsrd_avx(ZEXT416(uVar15),iVar23,1);
  auVar26 = vcvtudq2ps_avx512vl(auVar27);
  auVar27 = vinsertps_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar25),0x10);
  TVar2 = (this->m_patch_size).super_Tuple2<pbrt::Vector2,_float>;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * fVar32)),auVar35,ZEXT416((uint)(1.0 - fVar32)));
  PVar50.p.super_Tuple2<pbrt::Vector2,_float>.x = TVar2.x * (auVar27._0_4_ + auVar26._0_4_);
  PVar50.p.super_Tuple2<pbrt::Vector2,_float>.y = TVar2.y * (auVar27._4_4_ + auVar26._4_4_);
  PVar50.pdf = auVar35._0_4_ *
               (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
               (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  return PVar50;
}

Assistant:

PBRT_CPU_GPU
    PLSample Sample(Vector2f sample, const Float *param = nullptr) const {
        /* Avoid degeneracies at the extrema */
        sample[0] = Clamp(sample[0], 1 - OneMinusEpsilon, OneMinusEpsilon);
        sample[1] = Clamp(sample[1], 1 - OneMinusEpsilon, OneMinusEpsilon);

        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim].data()[idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Sample the row first */
        uint32_t offset = 0;
        if (Dimension != 0)
            offset = slice_offset * m_size.y;

        auto fetch_marginal = [&](uint32_t idx) -> float {
            return lookup<Dimension>(m_marginal_cdf.data(), offset + idx, m_size.y,
                                     param_weight);
        };

        uint32_t row = FindInterval(
            m_size.y, [&](uint32_t idx) { return fetch_marginal(idx) < sample.y; });

        sample.y -= fetch_marginal(row);

        uint32_t slice_size = HProd(m_size);
        offset = row * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        bool is_const = std::abs(r0 - r1) < 1e-4f * (r0 + r1);
        sample.y = is_const ? (2.f * sample.y)
                            : (r0 - SafeSqrt(r0 * r0 - 2.f * sample.y * (r0 - r1)));
        sample.y /= is_const ? (r0 + r1) : (r0 - r1);

        /* Sample the column next */
        sample.x *= (1.f - sample.y) * r0 + sample.y * r1;

        auto fetch_conditional = [&](uint32_t idx) -> float {
            float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset + idx,
                                         slice_size, param_weight),
                  v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x,
                                         offset + idx, slice_size, param_weight);

            return (1.f - sample.y) * v0 + sample.y * v1;
        };

        uint32_t col = FindInterval(
            m_size.x, [&](uint32_t idx) { return fetch_conditional(idx) < sample.x; });

        sample.x -= fetch_conditional(col);

        offset += col;

        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight),
              c0 = std::fma((1.f - sample.y), v00, sample.y * v01),
              c1 = std::fma((1.f - sample.y), v10, sample.y * v11);

        is_const = std::abs(c0 - c1) < 1e-4f * (c0 + c1);
        sample.x = is_const ? (2.f * sample.x)
                            : (c0 - SafeSqrt(c0 * c0 - 2.f * sample.x * (c0 - c1)));
        sample.x /= is_const ? (c0 + c1) : (c0 - c1);

        return {Vector2f((col + sample.x) * m_patch_size.x,
                         (row + sample.y) * m_patch_size.y),
                ((1.f - sample.x) * c0 + sample.x * c1) * HProd(m_inv_patch_size)};
    }